

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O0

int Ssw_ClassesRefineConst1(Ssw_Cla_t *p,int fRecursive)

{
  Aig_Obj_t **pClass;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *local_70;
  int local_3c;
  int i;
  Aig_Obj_t **ppClassNew;
  Aig_Obj_t *pReprNew;
  Aig_Obj_t *pObj;
  int fRecursive_local;
  Ssw_Cla_t *p_local;
  
  Vec_PtrClear(p->vClassNew);
  for (local_3c = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), local_3c < iVar1; local_3c = local_3c + 1)
  {
    pAVar3 = p->pAig->pReprs[local_3c];
    pAVar2 = Aig_ManConst1(p->pAig);
    if (pAVar3 == pAVar2) {
      pAVar3 = Aig_ManObj(p->pAig,local_3c);
      iVar1 = (*p->pFuncNodeIsConst)(p->pManData,pAVar3);
      if (iVar1 == 0) {
        Vec_PtrPush(p->vClassNew,pAVar3);
      }
    }
  }
  iVar1 = Vec_PtrSize(p->vClassNew);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else if (p->fConstCorr == 0) {
    iVar1 = Vec_PtrSize(p->vClassNew);
    p->nCands1 = p->nCands1 - iVar1;
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,0);
    Aig_ObjSetRepr(p->pAig,pAVar3,(Aig_Obj_t *)0x0);
    iVar1 = Vec_PtrSize(p->vClassNew);
    if (iVar1 == 1) {
      p_local._4_4_ = 1;
    }
    else {
      pClass = p->pMemClassesFree;
      iVar1 = Vec_PtrSize(p->vClassNew);
      p->pMemClassesFree = p->pMemClassesFree + iVar1;
      for (local_3c = 0; iVar1 = Vec_PtrSize(p->vClassNew), local_3c < iVar1;
          local_3c = local_3c + 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,local_3c);
        pClass[local_3c] = pAVar2;
        local_70 = pAVar3;
        if (local_3c == 0) {
          local_70 = (Aig_Obj_t *)0x0;
        }
        Aig_ObjSetRepr(p->pAig,pAVar2,local_70);
      }
      iVar1 = Vec_PtrSize(p->vClassNew);
      Ssw_ObjAddClass(p,pAVar3,pClass,iVar1);
      if (fRecursive == 0) {
        p_local._4_4_ = 1;
      }
      else {
        iVar1 = Ssw_ClassesRefineOneClass(p,pAVar3,1);
        p_local._4_4_ = iVar1 + 1;
      }
    }
  }
  else {
    for (local_3c = 0; iVar1 = Vec_PtrSize(p->vClassNew), local_3c < iVar1; local_3c = local_3c + 1)
    {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,local_3c);
      Aig_ObjSetRepr(p->pAig,pAVar3,(Aig_Obj_t *)0x0);
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Ssw_ClassesRefineConst1( Ssw_Cla_t * p, int fRecursive )
{
    Aig_Obj_t * pObj, * pReprNew, ** ppClassNew;
    int i;
    // collect the nodes to be refined
    Vec_PtrClear( p->vClassNew );
    for ( i = 0; i < Vec_PtrSize(p->pAig->vObjs); i++ )
        if ( p->pAig->pReprs[i] == Aig_ManConst1(p->pAig) )
        {
            pObj = Aig_ManObj( p->pAig, i );
            if ( !p->pFuncNodeIsConst( p->pManData, pObj ) )
            {
                Vec_PtrPush( p->vClassNew, pObj );
//                Vec_PtrPush( p->vRefined, pObj );
            }
        }
    // check if there is a new class
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
    if ( p->fConstCorr )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
            Aig_ObjSetRepr( p->pAig, pObj, NULL );
        return 1;
    }
    p->nCands1 -= Vec_PtrSize(p->vClassNew);
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    Aig_ObjSetRepr( p->pAig, pReprNew, NULL );
    if ( Vec_PtrSize(p->vClassNew) == 1 )
        return 1;
    // create a new class composed of these nodes
    ppClassNew = p->pMemClassesFree;
    p->pMemClassesFree += Vec_PtrSize(p->vClassNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }
    Ssw_ObjAddClass( p, pReprNew, ppClassNew, Vec_PtrSize(p->vClassNew) );
    // refine them recursively
    if ( fRecursive )
        return 1 + Ssw_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}